

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsingleshottimer.cpp
# Opt level: O0

void __thiscall QSingleShotTimer::timerEvent(QSingleShotTimer *this,QTimerEvent *event)

{
  bool bVar1;
  TimerId TVar2;
  QTimerEvent *in_RSI;
  QSingleShotTimer *in_RDI;
  QDeadlineTimer *deadline;
  StartTimerEvent *startTimerEvent;
  Duration in_stack_00000078;
  QObject *parent;
  QDeadlineTimer *in_stack_ffffffffffffffd8;
  QDeadlineTimer *this_00;
  TimerType timerType;
  QTimerEvent *this_01;
  
  TVar2 = QTimerEvent::id(in_RSI);
  if (TVar2 == Invalid) {
    this_01 = in_RSI;
    std::unique_ptr<QSingleShotTimer,_std::default_delete<QSingleShotTimer>_>::release
              ((unique_ptr<QSingleShotTimer,_std::default_delete<QSingleShotTimer>_> *)0x426f27);
    this_00 = (QDeadlineTimer *)&in_RSI[1].super_QEvent.t;
    bVar1 = QDeadlineTimer::hasExpired(this_00);
    timerType = (TimerType)((ulong)in_RSI >> 0x20);
    if (bVar1) {
      timerFinished(in_RDI);
    }
    else {
      parent = (QObject *)&in_RDI->timer;
      QDeadlineTimer::remainingTimeAsDuration(in_stack_ffffffffffffffd8);
      QDeadlineTimer::timerType(this_00);
      QBasicTimer::start((QBasicTimer *)this_01,in_stack_00000078,timerType,(QObject *)this_00);
      QThread::currentThread();
      QThread::eventDispatcher((QThread *)in_RDI);
      QObject::setParent(&in_RDI->super_QObject,parent);
    }
  }
  else {
    QBasicTimer::stop((QBasicTimer *)in_stack_ffffffffffffffd8);
    timerFinished(in_RDI);
  }
  return;
}

Assistant:

void QSingleShotTimer::timerEvent(QTimerEvent *event)
{
    if (event->id() == Qt::TimerId::Invalid) {
        StartTimerEvent *startTimerEvent = static_cast<StartTimerEvent *>(event);
        Q_UNUSED(startTimerEvent->timer.release()); // it's the same as "this"
        const QDeadlineTimer &deadline = startTimerEvent->deadline;
        if (deadline.hasExpired()) {
            timerFinished();
        } else {
            timer.start(deadline.remainingTimeAsDuration(), deadline.timerType(), this);
            // we are now definitely in a thread that has an event dispatcher
            setParent(QThread::currentThread()->eventDispatcher());
        }
    } else {
        // need to kill the timer _before_ we emit timeout() in case the
        // slot connected to timeout calls processEvents()
        timer.stop();

        timerFinished();
    }
}